

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellReissner4::GetStateBlock
          (ChElementShellReissner4 *this,ChVectorDynamic<> *mD)

{
  double *pdVar1;
  pointer psVar2;
  element_type *peVar3;
  void *pvVar4;
  undefined8 *puVar5;
  double *pdVar6;
  Index index_7;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  pdVar6 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if ((mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0x1c)
  {
    if (pdVar6 != (double *)0x0) {
      free((void *)pdVar6[-1]);
    }
    pvVar4 = malloc(0x120);
    if (pvVar4 == (void *)0x0) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *(void **)(((ulong)pvVar4 & 0xffffffffffffffc0) + 0x38) = pvVar4;
    pdVar6 = (double *)(((ulong)pvVar4 & 0xffffffffffffffc0) + 0x40);
    (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = pdVar6;
  }
  (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0x1c;
  uVar7 = 3;
  psVar2 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar3 = (psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (((ulong)pdVar6 & 7) == 0) {
    uVar8 = -((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar8 < 3) {
      uVar7 = (ulong)uVar8;
    }
    if (uVar8 != 0) goto LAB_00789d8e;
  }
  else {
LAB_00789d8e:
    uVar9 = 0;
    do {
      pdVar6[uVar9] = *(double *)((long)&peVar3->super_ChNodeFEAbase + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  if (uVar7 < 3) {
    do {
      pdVar6[uVar7] = *(double *)((long)&peVar3->super_ChNodeFEAbase + uVar7 * 8 + 0x20);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 3);
  }
  pdVar1 = pdVar6 + 3;
  uVar7 = 4;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar8 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar8 < 4) {
      uVar7 = (ulong)uVar8;
    }
    if (uVar8 != 0) goto LAB_00789de7;
  }
  else {
LAB_00789de7:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar3->field_0x38 + uVar9 * 8);
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  if (uVar7 < 4) {
    do {
      pdVar1[uVar7] = *(double *)((long)&peVar3->field_0x38 + uVar7 * 8);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 4);
  }
  peVar3 = psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar6 + 7;
  uVar7 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar8 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar8 < 3) {
      uVar7 = (ulong)uVar8;
    }
    if (uVar8 != 0) goto LAB_00789e47;
  }
  else {
LAB_00789e47:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar3->super_ChNodeFEAbase + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  if (uVar7 < 3) {
    do {
      pdVar1[uVar7] = *(double *)((long)&peVar3->super_ChNodeFEAbase + uVar7 * 8 + 0x20);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 3);
  }
  pdVar1 = pdVar6 + 10;
  uVar7 = 4;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar8 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar8 < 4) {
      uVar7 = (ulong)uVar8;
    }
    if (uVar8 != 0) goto LAB_00789ea3;
  }
  else {
LAB_00789ea3:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar3->field_0x38 + uVar9 * 8);
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  if (uVar7 < 4) {
    do {
      pdVar1[uVar7] = *(double *)((long)&peVar3->field_0x38 + uVar7 * 8);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 4);
  }
  peVar3 = psVar2[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar6 + 0xe;
  uVar7 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar8 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar8 < 3) {
      uVar7 = (ulong)uVar8;
    }
    if (uVar8 != 0) goto LAB_00789f03;
  }
  else {
LAB_00789f03:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar3->super_ChNodeFEAbase + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  if (uVar7 < 3) {
    do {
      pdVar1[uVar7] = *(double *)((long)&peVar3->super_ChNodeFEAbase + uVar7 * 8 + 0x20);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 3);
  }
  pdVar1 = pdVar6 + 0x11;
  uVar7 = 4;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar8 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar8 < 4) {
      uVar7 = (ulong)uVar8;
    }
    if (uVar8 != 0) goto LAB_00789f62;
  }
  else {
LAB_00789f62:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar3->field_0x38 + uVar9 * 8);
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  if (uVar7 < 4) {
    do {
      pdVar1[uVar7] = *(double *)((long)&peVar3->field_0x38 + uVar7 * 8);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 4);
  }
  peVar3 = psVar2[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar6 + 0x15;
  uVar7 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar8 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar8 < 3) {
      uVar7 = (ulong)uVar8;
    }
    if (uVar8 != 0) goto LAB_00789fbf;
  }
  else {
LAB_00789fbf:
    uVar9 = 0;
    do {
      pdVar1[uVar9] = *(double *)((long)&peVar3->super_ChNodeFEAbase + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  if (uVar7 < 3) {
    do {
      pdVar1[uVar7] = *(double *)((long)&peVar3->super_ChNodeFEAbase + uVar7 * 8 + 0x20);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 3);
  }
  pdVar6 = pdVar6 + 0x18;
  uVar7 = 4;
  if (((ulong)pdVar6 & 7) == 0) {
    uVar8 = -((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar8 < 4) {
      uVar7 = (ulong)uVar8;
    }
    if (uVar8 == 0) goto LAB_0078a02a;
  }
  uVar9 = 0;
  do {
    pdVar6[uVar9] = *(double *)((long)&peVar3->field_0x38 + uVar9 * 8);
    uVar9 = uVar9 + 1;
  } while (uVar7 != uVar9);
LAB_0078a02a:
  if (uVar7 < 4) {
    do {
      pdVar6[uVar7] = *(double *)((long)&peVar3->field_0x38 + uVar7 * 8);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 4);
  }
  return;
}

Assistant:

void ChElementShellReissner4::GetStateBlock(ChVectorDynamic<>& mD) {
    mD.resize(4 * 7, 1);

    mD.segment(0, 3) = m_nodes[0]->GetPos().eigen();
    mD.segment(3, 4) = m_nodes[0]->GetRot().eigen();

    mD.segment(7, 3) = m_nodes[1]->GetPos().eigen();
    mD.segment(10, 4) = m_nodes[1]->GetRot().eigen();

    mD.segment(14, 3) = m_nodes[2]->GetPos().eigen();
    mD.segment(17, 4) = m_nodes[2]->GetRot().eigen();

    mD.segment(21, 3) = m_nodes[3]->GetPos().eigen();
    mD.segment(24, 4) = m_nodes[3]->GetRot().eigen();
}